

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_pkg.c
# Opt level: O1

void dill_lookup_xfer_addrs(call_t *t,xfer_entry *x)

{
  int iVar1;
  char *pcVar2;
  call_location *pcVar3;
  char *__s2;
  int iVar4;
  xfer_entry *pxVar5;
  long lVar6;
  char *__s1;
  
  iVar1 = t->call_count;
  if (0 < (long)iVar1) {
    pcVar2 = x->xfer_name;
    lVar6 = 0;
    do {
      if (pcVar2 != (char *)0x0) {
        pcVar3 = t->call_locs;
        __s2 = pcVar3[lVar6].xfer_name;
        pxVar5 = x + 1;
        __s1 = pcVar2;
        do {
          iVar4 = strcmp(__s1,__s2);
          if (iVar4 == 0) {
            pcVar3[lVar6].xfer_addr = pxVar5[-1].xfer_addr;
          }
          __s1 = pxVar5->xfer_name;
          pxVar5 = pxVar5 + 1;
        } while (__s1 != (char *)0x0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  return;
}

Assistant:

extern void
dill_lookup_xfer_addrs(call_t* t, xfer_entry* x)
{
    int i;
    for (i = 0; i < t->call_count; i++) {
        xfer_entry* e = x;
        while (e->xfer_name != NULL) {
            if (strcmp(e->xfer_name, t->call_locs[i].xfer_name) == 0) {
                t->call_locs[i].xfer_addr = e->xfer_addr;
            }
            e++;
        }
    }
}